

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_encoder.cc
# Opt level: O0

bool __thiscall
draco::MeshSequentialEncoder::GenerateAttributesEncoder(MeshSequentialEncoder *this,int32_t att_id)

{
  ValueType VVar1;
  PointCloud *this_00;
  int in_ESI;
  PointCloudEncoder *in_RDI;
  pointer in_stack_ffffffffffffff98;
  pointer __p;
  PointCloudEncoder *in_stack_ffffffffffffffa0;
  PointCloudEncoder *this_01;
  undefined4 in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  AttributesEncoder *in_stack_ffffffffffffffb0;
  undefined1 local_20 [32];
  
  if (in_ESI == 0) {
    operator_new(0xa8);
    operator_new(0x18);
    this_00 = PointCloudEncoder::point_cloud(in_RDI);
    VVar1 = PointCloud::num_points(this_00);
    LinearSequencer::LinearSequencer
              ((LinearSequencer *)in_stack_ffffffffffffffa0,
               (int32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    this_01 = (PointCloudEncoder *)local_20;
    std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::
    unique_ptr<std::default_delete<draco::PointsSequencer>,void>
              ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               this_01,in_stack_ffffffffffffff98);
    SequentialAttributeEncodersController::SequentialAttributeEncodersController
              ((SequentialAttributeEncodersController *)this_00,
               (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               CONCAT44(VVar1,in_stack_ffffffffffffffa8),(int)((ulong)this_01 >> 0x20));
    __p = (pointer)(local_20 + 8);
    std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>::
    unique_ptr<std::default_delete<draco::AttributesEncoder>,void>
              ((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)this_01,__p);
    PointCloudEncoder::AddAttributesEncoder
              (this_01,(unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        *)__p);
    std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
    ~unique_ptr((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 *)this_00);
    std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
    ~unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                this_01);
  }
  else {
    PointCloudEncoder::attributes_encoder
              (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    AttributesEncoder::AddAttributeId(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  return true;
}

Assistant:

bool MeshSequentialEncoder::GenerateAttributesEncoder(int32_t att_id) {
  // Create only one attribute encoder that is going to encode all points in a
  // linear sequence.
  if (att_id == 0) {
    // Create a new attribute encoder only for the first attribute.
    AddAttributesEncoder(std::unique_ptr<AttributesEncoder>(
        new SequentialAttributeEncodersController(
            std::unique_ptr<PointsSequencer>(
                new LinearSequencer(point_cloud()->num_points())),
            att_id)));
  } else {
    // Reuse the existing attribute encoder for other attributes.
    attributes_encoder(0)->AddAttributeId(att_id);
  }
  return true;
}